

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int64_t float128_to_int64_mips64el(float128 a,float_status *status)

{
  int64_t iVar1;
  byte bVar2;
  ulong uVar3;
  uint64_t absZ1;
  ulong uVar4;
  uint64_t absZ0;
  uint uVar5;
  
  uVar4 = a.low;
  uVar3 = a.high & 0xffffffffffff;
  uVar5 = a.high._6_2_ & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
LAB_009202f5:
    absZ1 = (uint64_t)(uVar3 != 0 || uVar4 != 0);
  }
  else {
    absZ0 = uVar3 + 0x1000000000000;
    if (0x402e < uVar5) {
      if (0x403e < uVar5) {
        status->float_exception_flags = status->float_exception_flags | 1;
        if (-1 < (long)a.high) {
          return 0x7fffffffffffffff;
        }
        iVar1 = 0x7fffffffffffffff;
        if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
            uVar4 == 0) {
          iVar1 = -0x8000000000000000;
        }
        if (uVar5 != 0x7fff) {
          iVar1 = -0x8000000000000000;
        }
        return iVar1;
      }
      bVar2 = (byte)(uVar5 - 0x402f);
      absZ1 = uVar4 << (bVar2 & 0x3f);
      if (uVar5 - 0x402f != 0) {
        absZ0 = absZ0 << (bVar2 & 0x3f) | uVar4 >> (0x2fU - a.high._6_1_ & 0x3f);
      }
      goto LAB_00920300;
    }
    if (0x3fef < uVar5) {
      absZ1 = (ulong)(uVar4 != 0) | absZ0 << (a.high._6_1_ + 0x11U & 0x3f);
      absZ0 = absZ0 >> (0x2fU - (char)uVar5 & 0x3f);
      goto LAB_00920300;
    }
    uVar3 = 1;
    if (uVar5 != 0x3fef) goto LAB_009202f5;
    absZ1 = absZ0 | uVar4 != 0;
  }
  absZ0 = 0;
LAB_00920300:
  iVar1 = roundAndPackInt64(a.high._7_1_ >> 7,absZ0,absZ1,status);
  return iVar1;
}

Assistant:

int64_t float128_to_int64(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp ) aSig0 |= UINT64_C(0x0001000000000000);
    shiftCount = 0x402F - aExp;
    if ( shiftCount <= 0 ) {
        if ( 0x403E < aExp ) {
            float_raise(float_flag_invalid, status);
            if (    ! aSign
                 || (    ( aExp == 0x7FFF )
                      && ( aSig1 || ( aSig0 != UINT64_C(0x0001000000000000) ) )
                    )
               ) {
                return INT64_MAX;
            }
            return INT64_MIN;
        }
        shortShift128Left( aSig0, aSig1, - shiftCount, &aSig0, &aSig1 );
    }
    else {
        shift64ExtraRightJamming( aSig0, aSig1, shiftCount, &aSig0, &aSig1 );
    }
    return roundAndPackInt64(aSign, aSig0, aSig1, status);

}